

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O1

void __thiscall Common::File::File(File *this,FILE *fp,bool exclusive)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  undefined7 in_register_00000011;
  _IO_FILE *__tmp;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_20 [2];
  
  (this->_file).super___shared_ptr<_IO_FILE,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->_file).super___shared_ptr<_IO_FILE,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if ((int)CONCAT71(in_register_00000011,exclusive) == 0) {
    p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
    p_Var3->_M_use_count = 1;
    p_Var3->_M_weak_count = 1;
    p_Var3->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_base_00152d60;
    p_Var3[1]._vptr__Sp_counted_base = (_func_int **)fp;
    (this->_file).super___shared_ptr<_IO_FILE,_(__gnu_cxx::_Lock_policy)2>._M_ptr = fp;
    p_Var1 = (this->_file).super___shared_ptr<_IO_FILE,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
    (this->_file).super___shared_ptr<_IO_FILE,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         p_Var3;
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
      return;
    }
  }
  else {
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<_IO_FILE*,int(*)(_IO_FILE*),std::allocator<void>,void>(a_Stack_20,fp,fclose);
    _Var2._M_pi = a_Stack_20[0]._M_pi;
    a_Stack_20[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var1 = (this->_file).super___shared_ptr<_IO_FILE,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
    (this->_file).super___shared_ptr<_IO_FILE,_(__gnu_cxx::_Lock_policy)2>._M_ptr = fp;
    (this->_file).super___shared_ptr<_IO_FILE,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         _Var2._M_pi;
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    }
    if (a_Stack_20[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_20[0]._M_pi);
    }
  }
  return;
}

Assistant:

File::File(FILE *fp, bool exclusive) {
	if (exclusive) {
		_file = FilePtr(fp, fclose);
	}
	else {
		_file = FilePtr(fp, [](FILE*) {});
	}
}